

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableExtensionGenerator::~ImmutableExtensionGenerator
          (ImmutableExtensionGenerator *this)

{
  ImmutableExtensionGenerator *this_local;
  
  (this->super_ExtensionGenerator)._vptr_ExtensionGenerator =
       (_func_int **)&PTR__ImmutableExtensionGenerator_006f5ba8;
  std::__cxx11::string::~string((string *)&this->scope_);
  ExtensionGenerator::~ExtensionGenerator(&this->super_ExtensionGenerator);
  return;
}

Assistant:

ImmutableExtensionGenerator::~ImmutableExtensionGenerator() {}